

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_index.cpp
# Opt level: O2

bool __thiscall
MeCab::EncoderFeatureIndex::buildFeature(EncoderFeatureIndex *this,LearnerPath *path)

{
  DictionaryRewriter *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
  *this_01;
  int *piVar1;
  bool bVar2;
  ostream *poVar3;
  StringBuffer *pSVar4;
  iterator iVar5;
  StringBuffer *pSVar6;
  mecab_learner_node_t *pmVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  char *pcVar8;
  die local_141;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>
  local_140;
  string key;
  string lfeature2;
  string ufeature2;
  string rfeature1;
  string rfeature2;
  string lfeature1;
  string ufeature1;
  
  path->cost = 0.0;
  path->rnode->wcost = 0.0;
  ufeature1._M_dataplus._M_p = (pointer)&ufeature1.field_2;
  ufeature1._M_string_length = 0;
  lfeature1._M_dataplus._M_p = (pointer)&lfeature1.field_2;
  lfeature1._M_string_length = 0;
  ufeature1.field_2._M_local_buf[0] = '\0';
  lfeature1.field_2._M_local_buf[0] = '\0';
  rfeature1._M_dataplus._M_p = (pointer)&rfeature1.field_2;
  rfeature1._M_string_length = 0;
  ufeature2._M_dataplus._M_p = (pointer)&ufeature2.field_2;
  ufeature2._M_string_length = 0;
  rfeature1.field_2._M_local_buf[0] = '\0';
  ufeature2.field_2._M_local_buf[0] = '\0';
  lfeature2._M_dataplus._M_p = (pointer)&lfeature2.field_2;
  lfeature2._M_string_length = 0;
  rfeature2._M_dataplus._M_p = (pointer)&rfeature2.field_2;
  rfeature2._M_string_length = 0;
  lfeature2.field_2._M_local_buf[0] = '\0';
  rfeature2.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_140,path->lnode->feature,(allocator *)&key);
  this_00 = &(this->super_FeatureIndex).rewrite_;
  bVar2 = DictionaryRewriter::rewrite2(this_00,&local_140.first,&ufeature1,&lfeature1,&rfeature1);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x112);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->lnode->feature, &ufeature1, &lfeature1, &rfeature1)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    std::operator<<(poVar3,path->lnode->feature);
    die::~die(&local_141);
  }
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::string((string *)&local_140,path->rnode->feature,(allocator *)&key);
  pmVar7 = (mecab_learner_node_t *)&lfeature2;
  bVar2 = DictionaryRewriter::rewrite2
                    (this_00,&local_140.first,&ufeature2,(string *)pmVar7,&rfeature2);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x119);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,
                             "rewrite_.rewrite2(path->rnode->feature, &ufeature2, &lfeature2, &rfeature2)"
                            );
    poVar3 = std::operator<<(poVar3,"] ");
    poVar3 = std::operator<<(poVar3," cannot rewrite pattern: ");
    pmVar7 = path->rnode;
    std::operator<<(poVar3,pmVar7->feature);
    die::~die(&local_141);
  }
  std::__cxx11::string::~string((string *)&local_140);
  pSVar6 = &(this->super_FeatureIndex).os_;
  (this->super_FeatureIndex).os_.size_ = 0;
  pSVar4 = (StringBuffer *)
           StringBuffer::write(pSVar6,(int)ufeature2._M_dataplus._M_p,__buf,(size_t)pmVar7);
  pSVar4 = (StringBuffer *)StringBuffer::write(pSVar4,0x20,__buf_00,(size_t)pmVar7);
  pmVar7 = path->rnode;
  pSVar4 = (StringBuffer *)
           StringBuffer::write(pSVar4,(int)(char)pmVar7->char_type,__buf_01,(size_t)pmVar7);
  StringBuffer::write(pSVar4,0,__buf_02,(size_t)pmVar7);
  if ((this->super_FeatureIndex).os_.error_ == false) {
    pcVar8 = (this->super_FeatureIndex).os_.ptr_;
  }
  else {
    pcVar8 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)&key,pcVar8,(allocator *)&local_140);
  this_01 = &this->feature_cache_;
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                  *)this_01,&key);
  if (iVar5._M_node == (_Base_ptr)&this->field_0x1a8) {
    FeatureIndex::buildUnigramFeature(&this->super_FeatureIndex,path,ufeature2._M_dataplus._M_p);
    piVar1 = path->rnode->fvector;
    std::__cxx11::string::string((string *)&local_140,(string *)&key);
    local_140.second.second = 1;
    local_140.second.first = piVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
                *)this_01,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    pmVar7 = *(mecab_learner_node_t **)(iVar5._M_node + 2);
    path->rnode->fvector = (int *)pmVar7;
    iVar5._M_node[2]._M_parent = (_Base_ptr)((long)&(iVar5._M_node[2]._M_parent)->_M_color + 1);
  }
  std::__cxx11::string::~string((string *)&key);
  (this->super_FeatureIndex).os_.size_ = 0;
  pSVar6 = (StringBuffer *)
           StringBuffer::write(pSVar6,(int)rfeature1._M_dataplus._M_p,__buf_03,(size_t)pmVar7);
  pSVar6 = (StringBuffer *)StringBuffer::write(pSVar6,0x20,__buf_04,(size_t)pmVar7);
  pSVar6 = (StringBuffer *)
           StringBuffer::write(pSVar6,(int)lfeature2._M_dataplus._M_p,__buf_05,(size_t)pmVar7);
  StringBuffer::write(pSVar6,0,__buf_06,(size_t)pmVar7);
  if ((this->super_FeatureIndex).os_.error_ == false) {
    pcVar8 = (this->super_FeatureIndex).os_.ptr_;
  }
  else {
    pcVar8 = (char *)0x0;
  }
  std::__cxx11::string::string((string *)&key,pcVar8,(allocator *)&local_140);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_int_*,_unsigned_long>_>_>_>
                  *)this_01,&key);
  if (iVar5._M_node == (_Base_ptr)&this->field_0x1a8) {
    FeatureIndex::buildBigramFeature
              (&this->super_FeatureIndex,path,rfeature1._M_dataplus._M_p,lfeature2._M_dataplus._M_p)
    ;
    piVar1 = path->fvector;
    std::__cxx11::string::string((string *)&local_140,(string *)&key);
    local_140.second.second = 1;
    local_140.second.first = piVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::pair<int_const*,unsigned_long>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<int_const*,unsigned_long>>>>
                *)this_01,&local_140);
    std::__cxx11::string::~string((string *)&local_140);
  }
  else {
    path->fvector = *(int **)(iVar5._M_node + 2);
    iVar5._M_node[2]._M_parent = (_Base_ptr)((long)&(iVar5._M_node[2]._M_parent)->_M_color + 1);
  }
  std::__cxx11::string::~string((string *)&key);
  if (path->fvector == (int *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x145);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"path->fvector");
    poVar3 = std::operator<<(poVar3,"] ");
    std::operator<<(poVar3," fvector is NULL");
    die::~die((die *)&local_140);
  }
  if (path->rnode->fvector == (int *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/feature_index.cpp"
                            );
    poVar3 = std::operator<<(poVar3,"(");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x146);
    poVar3 = std::operator<<(poVar3,") [");
    poVar3 = std::operator<<(poVar3,"path->rnode->fvector");
    poVar3 = std::operator<<(poVar3,"] ");
    std::operator<<(poVar3,"fevector is NULL");
    die::~die((die *)&local_140);
  }
  std::__cxx11::string::~string((string *)&rfeature2);
  std::__cxx11::string::~string((string *)&lfeature2);
  std::__cxx11::string::~string((string *)&ufeature2);
  std::__cxx11::string::~string((string *)&rfeature1);
  std::__cxx11::string::~string((string *)&lfeature1);
  std::__cxx11::string::~string((string *)&ufeature1);
  return true;
}

Assistant:

bool EncoderFeatureIndex::buildFeature(LearnerPath *path) {
  path->rnode->wcost = path->cost = 0.0;

  std::string ufeature1;
  std::string lfeature1;
  std::string rfeature1;
  std::string ufeature2;
  std::string lfeature2;
  std::string rfeature2;

  CHECK_DIE(rewrite_.rewrite2(path->lnode->feature,
                              &ufeature1,
                              &lfeature1,
                              &rfeature1))
      << " cannot rewrite pattern: "
      << path->lnode->feature;

  CHECK_DIE(rewrite_.rewrite2(path->rnode->feature,
                              &ufeature2,
                              &lfeature2,
                              &rfeature2))
      << " cannot rewrite pattern: "
      << path->rnode->feature;

  {
    os_.clear();
    os_ << ufeature2 << ' ' << path->rnode->char_type << '\0';
    const std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->rnode->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildUnigramFeature(path, ufeature2.c_str())) {
        return false;
      }
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key,
                             std::pair<const int *, size_t>
                             (path->rnode->fvector, 1)));
    }
  }

  {
    os_.clear();
    os_ << rfeature1 << ' ' << lfeature2 << '\0';
    std::string key(os_.str());
    std::map<std::string, std::pair<const int *, size_t> >::iterator
        it = feature_cache_.find(key);
    if (it != feature_cache_.end()) {
      path->fvector = it->second.first;
      it->second.second++;
    } else {
      if (!buildBigramFeature(path, rfeature1.c_str(), lfeature2.c_str()))
        return false;
      feature_cache_.insert(std::pair
                            <std::string, std::pair<const int *, size_t> >
                            (key, std::pair<const int *, size_t>
                             (path->fvector, 1)));
    }
  }

  CHECK_DIE(path->fvector) << " fvector is NULL";
  CHECK_DIE(path->rnode->fvector) << "fevector is NULL";

  return true;
}